

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

uc_err reg_read_mipsel(void *_env,int mode,uint regid,void *value,size_t *size)

{
  uc_err local_3c;
  uc_err ret;
  CPUMIPSState_conflict2 *env;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  local_3c = UC_ERR_ARG;
  if ((regid < 2) || (0x21 < regid)) {
    if (regid == 1) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_3c = UC_ERR_OK;
      *(undefined4 *)value = *(undefined4 *)((long)_env + 0x80);
    }
    else if (regid == 0x81) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_3c = UC_ERR_OK;
      *(undefined4 *)value = *(undefined4 *)((long)_env + 0x84);
    }
    else if (regid == 0x82) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_3c = UC_ERR_OK;
      *(undefined4 *)value = *(undefined4 *)((long)_env + 0x94);
    }
    else if (regid == 0x89) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_3c = UC_ERR_OK;
      *(undefined4 *)value = *(undefined4 *)((long)_env + 0x570);
    }
    else if (regid == 0x8a) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_3c = UC_ERR_OK;
      *(undefined4 *)value = *(undefined4 *)((long)_env + 0xd4);
    }
    else if (regid == 0x8b) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_3c = UC_ERR_OK;
      *(undefined4 *)value = *(undefined4 *)((long)_env + 0x53c);
    }
  }
  else {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    local_3c = UC_ERR_OK;
    *(undefined4 *)value = *(undefined4 *)((long)_env + (ulong)(regid - 2) * 4);
  }
  return local_3c;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUMIPSState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_MIPS_REG_0 && regid <= UC_MIPS_REG_31) {
        CHECK_REG_TYPE(mipsreg_t);
        *(mipsreg_t *)value = env->active_tc.gpr[regid - UC_MIPS_REG_0];
    } else {
        switch (regid) {
        default:
            break;
        case UC_MIPS_REG_HI:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.HI[0];
            break;
        case UC_MIPS_REG_LO:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.LO[0];
            break;
        case UC_MIPS_REG_PC:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.PC;
            break;
        case UC_MIPS_REG_CP0_CONFIG3:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->CP0_Config3;
            break;
        case UC_MIPS_REG_CP0_STATUS:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->CP0_Status;
            break;
        case UC_MIPS_REG_CP0_USERLOCAL:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.CP0_UserLocal;
            break;
        }
    }

    return ret;
}